

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall simple_json::Stream::emit_json_key_value(Stream *this,string *key,string *value)

{
  StringStream<4096UL,_4096UL> *this_00;
  
  emit_json_key(this,key);
  this_00 = &this->buffer;
  spirv_cross::StringStream<4096UL,_4096UL>::append(this_00,"\"",1);
  spirv_cross::StringStream<4096UL,_4096UL>::append
            (this_00,(value->_M_dataplus)._M_p,value->_M_string_length);
  spirv_cross::StringStream<4096UL,_4096UL>::append(this_00,"\"",1);
  return;
}

Assistant:

void Stream::emit_json_key_value(const std::string &key, const std::string &value)
{
	emit_json_key(key);
	statement_inner("\"", value, "\"");
}